

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::PlainGatherDepthCube::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_30 [2];
  long local_20 [2];
  
  (**(code **)(*this + 0xb8))(local_30);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		return Type() + " test_function(vec4 p) {                                \n"
						"    return textureGather(my_sampler, vec3(p.x, p.y, p.z), p.w);  \n"
						"}\n";
	}